

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O2

void write_global_config(char *config)

{
  ALLEGRO_CONFIG *cfg;
  
  cfg = (ALLEGRO_CONFIG *)al_load_config_file();
  if (cfg == (ALLEGRO_CONFIG *)0x0) {
    cfg = (ALLEGRO_CONFIG *)al_create_config();
  }
  set_config_int(cfg,"GFX","fullscreen",fullscreen);
  set_config_int(cfg,"GFX","bit_depth",bit_depth);
  set_config_int(cfg,"GFX","screen_width",screen_width);
  set_config_int(cfg,"GFX","screen_height",screen_height);
  set_config_int(cfg,"GFX","window_width",window_width);
  set_config_int(cfg,"GFX","window_height",window_height);
  set_config_int(cfg,"GFX","samples",screen_samples);
  set_config_int(cfg,"GFX","vsync",use_vsync);
  set_config_int(cfg,"TIMING","logic_framerate",logic_framerate);
  set_config_int(cfg,"TIMING","max_frame_skip",max_frame_skip);
  set_config_int(cfg,"TIMING","limit_framerate",limit_framerate);
  set_config_int(cfg,"TIMING","display_framerate",display_framerate);
  set_config_int(cfg,"TIMING","reduce_cpu_usage",reduce_cpu_usage);
  set_config_int(cfg,"SOUND","sound_volume",sound_volume);
  set_config_int(cfg,"SOUND","music_volume",music_volume);
  set_config_int(cfg,"CONTROLS","controller_id",controller_id);
  al_save_config_file(config,cfg);
  al_destroy_config(cfg);
  return;
}

Assistant:

void write_global_config(const char *config)
{
   ALLEGRO_CONFIG *c = al_load_config_file(config);
   if (!c) c = al_create_config();

   set_config_int(c, "GFX", "fullscreen", fullscreen);
   set_config_int(c, "GFX", "bit_depth", bit_depth);
   set_config_int(c, "GFX", "screen_width", screen_width);
   set_config_int(c, "GFX", "screen_height", screen_height);
   set_config_int(c, "GFX", "window_width", window_width);
   set_config_int(c, "GFX", "window_height", window_height);
   set_config_int(c, "GFX", "samples", screen_samples);
   set_config_int(c, "GFX", "vsync", use_vsync);

   set_config_int(c, "TIMING", "logic_framerate", logic_framerate);
   set_config_int(c, "TIMING", "max_frame_skip", max_frame_skip);
   set_config_int(c, "TIMING", "limit_framerate", limit_framerate);
   set_config_int(c, "TIMING", "display_framerate", display_framerate);
   set_config_int(c, "TIMING", "reduce_cpu_usage", reduce_cpu_usage);

   set_config_int(c, "SOUND", "sound_volume", sound_volume);
   set_config_int(c, "SOUND", "music_volume", music_volume);

   set_config_int(c, "CONTROLS", "controller_id", controller_id);

   al_save_config_file(config, c);
   al_destroy_config(c);
}